

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

void __thiscall
ncnn::ConvolutionDepthWise_x86::~ConvolutionDepthWise_x86(ConvolutionDepthWise_x86 *this)

{
  Layer *pLVar1;
  pointer ppLVar2;
  pointer ppLVar3;
  long lVar4;
  
  (this->super_ConvolutionDepthWise).super_Layer._vptr_Layer =
       (_func_int **)&PTR__ConvolutionDepthWise_x86_00145520;
  ppLVar3 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar2 - (long)ppLVar3) >> 3)) {
    lVar4 = 0;
    do {
      pLVar1 = ppLVar3[lVar4];
      if (pLVar1 != (Layer *)0x0) {
        (*pLVar1->_vptr_Layer[1])(pLVar1);
        ppLVar3 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppLVar2 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)((ulong)((long)ppLVar2 - (long)ppLVar3) >> 3));
  }
  if (ppLVar2 != ppLVar3) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar3;
  }
  if (ppLVar3 != (pointer)0x0) {
    operator_delete(ppLVar3,(long)(this->group_ops).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar3)
    ;
  }
  ConvolutionDepthWise::~ConvolutionDepthWise(&this->super_ConvolutionDepthWise);
  return;
}

Assistant:

ConvolutionDepthWise_x86::~ConvolutionDepthWise_x86()
{
    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();
}